

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
slang::CommandLine::handlePlusArg
          (CommandLine *this,string_view arg,ParseOptions options,bool *hadUnknowns)

{
  Option *this_00;
  undefined1 auVar1 [16];
  CommandLine *pCVar2;
  size_type sVar3;
  size_t sVar4;
  iterator iVar5;
  char *pcVar6;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar7;
  bool bVar8;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  string result;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  CommandLine *local_80;
  string result_1;
  string local_50;
  
  local_c8 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  local_d8 = arg;
  local_80 = this;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_d8,'+',2);
  if (sVar3 == 0xffffffffffffffff) {
    bVar8 = true;
    pcVar6 = (char *)0x0;
  }
  else {
    local_c8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_d8,sVar3 + 1,0xffffffffffffffff);
    pcVar6 = local_c8._M_str;
    sVar4 = local_c8._M_len;
    local_d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_d8,0,sVar3);
    bVar8 = sVar4 == 0;
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&result,&local_d8,(allocator<char> *)&result_1);
  pCVar2 = local_80;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
          ::find(&(local_80->optionMap)._M_t,&result);
  std::__cxx11::string::~string((string *)&result);
  if ((_Rb_tree_header *)iVar5._M_node == &(pCVar2->optionMap)._M_t._M_impl.super__Rb_tree_header) {
    *hadUnknowns = true;
    result._M_dataplus._M_p = (pCVar2->programName)._M_dataplus._M_p;
    result._M_string_length = (pCVar2->programName)._M_string_length;
    result.field_2._M_allocated_capacity = (size_type)local_d8._M_str;
    result.field_2._8_8_ = local_d8._M_len;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x26;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&result;
    ::fmt::v9::vformat_abi_cxx11_
              (&result_1,(v9 *)"{}: unknown command line argument \'{}\'",fmt_00,args_00);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pCVar2->errors,
               &result_1);
  }
  else {
    this_00 = *(Option **)(iVar5._M_node + 2);
    if (!bVar8) {
      do {
        local_98 = local_c8;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_c8,'+',0);
        if (sVar3 == 0xffffffffffffffff) {
          local_c8 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
        }
        else {
          local_c8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&local_c8,sVar3 + 1,0xffffffffffffffff);
          local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&local_98,0,sVar3);
        }
        aVar7 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                 )local_98._M_str;
        Option::set_abi_cxx11_
                  (&result_1,this_00,local_d8,local_98,(bool)(options.ignoreDuplicates & 1));
        if (result_1._M_string_length != 0) {
          result._M_dataplus._M_p = (local_80->programName)._M_dataplus._M_p;
          result._M_string_length = (local_80->programName)._M_string_length;
          result.field_2._M_allocated_capacity = (size_type)result_1._M_dataplus._M_p;
          result.field_2._8_8_ = result_1._M_string_length;
          fmt_01.size_ = 0xdd;
          fmt_01.data_ = (char *)0x6;
          args_01.field_1.args_ = aVar7.args_;
          args_01.desc_ = (unsigned_long_long)&result;
          ::fmt::v9::vformat_abi_cxx11_(&local_50,(v9 *)"{}: {}",fmt_01,args_01);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pCVar2->errors,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::__cxx11::string::~string((string *)&result_1);
      } while (local_c8._M_len != 0);
      return;
    }
    if (*(__index_type *)
         ((long)&(this_00->storage).
                 super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                 .
                 super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
         + 0x20) == '\0') {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pcVar6;
      Option::set_abi_cxx11_
                (&result,this_00,local_d8,(string_view)(auVar1 << 0x40),
                 (bool)(options.ignoreDuplicates & 1));
      if (result._M_string_length != 0) {
        assert::assertFailed
                  ("result.empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/util/CommandLine.cpp"
                   ,0x240,
                   "void slang::CommandLine::handlePlusArg(string_view, ParseOptions, bool &)");
      }
      this_01 = &result;
      goto LAB_00196731;
    }
    result._M_dataplus._M_p = (pCVar2->programName)._M_dataplus._M_p;
    result._M_string_length = (pCVar2->programName)._M_string_length;
    result.field_2._M_allocated_capacity = (size_type)local_d8._M_str;
    result.field_2._8_8_ = local_d8._M_len;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x27;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&result;
    ::fmt::v9::vformat_abi_cxx11_
              (&result_1,(v9 *)"{}: no value provided for argument \'{}\'",fmt,args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pCVar2->errors,
               &result_1);
  }
  this_01 = &result_1;
LAB_00196731:
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void CommandLine::handlePlusArg(string_view arg, ParseOptions options, bool& hadUnknowns) {
    // Values are plus separated.
    string_view value;
    size_t idx = arg.find_first_of('+', 2);
    if (idx != string_view::npos) {
        value = arg.substr(idx + 1);
        arg = arg.substr(0, idx);
    }

    // TODO: change once we have heterogeneous lookup from C++20
    auto it = optionMap.find(std::string(arg));
    if (it == optionMap.end()) {
        hadUnknowns = true;
        errors.emplace_back(
            fmt::format("{}: unknown command line argument '{}'"sv, programName, arg));
        return;
    }

    auto option = it->second.get();
    if (value.empty()) {
        if (option->expectsValue()) {
            errors.emplace_back(
                fmt::format("{}: no value provided for argument '{}'"sv, programName, arg));
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            ASSERT(result.empty());
        }
        return;
    }

    do {
        string_view curr = value;
        idx = value.find_first_of('+');
        if (idx != string_view::npos) {
            value = value.substr(idx + 1);
            curr = curr.substr(0, idx);
        }
        else {
            value = {};
        }

        std::string result = option->set(arg, curr, options.ignoreDuplicates);
        if (!result.empty())
            errors.emplace_back(fmt::format("{}: {}", programName, result));

    } while (!value.empty());
}